

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  MPP_RET MVar6;
  size_t sVar7;
  FILE *__stream;
  FILE *__stream_00;
  RK_U8 *buf;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  MppFrame src_frm;
  MppFrame dst_frm;
  RgaCtx ctx;
  ulong local_270;
  MppBuffer dst_buf;
  MppBuffer src_buf;
  ulong local_258;
  RgaTestCmd cmd;
  
  _mpp_log_l(4,0,"rga test unit\n",0);
  src_buf = (MppBuffer)0x0;
  dst_buf = (MppBuffer)0x0;
  src_frm = (MppFrame)0x0;
  dst_frm = (MppFrame)0x0;
  ctx = (RgaCtx)0x0;
  memset(&cmd,0,0x220);
  if (argc < 2) {
LAB_001026e3:
    usage();
  }
  else {
    local_270 = CONCAT44(local_270._4_4_,0xffffffff);
    for (uVar8 = 1; (uint)argc != uVar8; uVar8 = uVar8 + 1) {
      pcVar10 = argv[uVar8];
      if ((*pcVar10 == '-') && (cVar1 = pcVar10[1], cVar1 != '\0')) {
        pcVar2 = argv[uVar8 + 1];
        if (cVar1 == '-') {
          cVar1 = pcVar10[2];
          if (cVar1 == '\0') break;
          pcVar10 = pcVar10 + 1;
        }
        switch(cVar1) {
        case 'd':
          if (pcVar10[2] == '\0') {
LAB_00102696:
            pcVar10 = "dst parameters is invalid\n";
LAB_001026ca:
            _mpp_log_l(2,0,pcVar10,0);
            goto LAB_001026d8;
          }
          pcVar10 = pcVar10 + 1;
          iVar11 = strncmp(pcVar10,"dst_w",5);
          if (iVar11 == 0) {
            cmd.dst_w = atoi(pcVar2);
          }
          else {
            iVar11 = strncmp(pcVar10,"dst_h",5);
            if (iVar11 == 0) {
              cmd.dst_h = atoi(pcVar2);
            }
            else {
              iVar11 = strncmp(pcVar10,"dst_fmt",5);
              if (iVar11 != 0) goto LAB_00102696;
              cmd.dst_fmt = atoi(pcVar2);
            }
          }
          break;
        case 'e':
        case 'g':
        case 'j':
        case 'k':
        case 'l':
        case 'm':
        case 'n':
          break;
        case 'f':
          if (pcVar2 == (char *)0x0) {
            pcVar10 = "src fmt is invalid\n";
            goto LAB_001026ca;
          }
          cmd.src_fmt = atoi(pcVar2);
          local_270 = CONCAT44(local_270._4_4_,1);
          if (0xffeb < cmd.src_fmt - MPP_FMT_YUV_BUTT) {
            local_270 = CONCAT44(local_270._4_4_,(uint)(0x1000f < (int)cmd.src_fmt));
          }
          break;
        case 'h':
          if (pcVar2 == (char *)0x0) {
            pcVar10 = "src height is invalid\n";
            goto LAB_001026ca;
          }
          cmd.src_h = atoi(pcVar2);
          break;
        case 'i':
          if (pcVar2 == (char *)0x0) {
            pcVar10 = "input file is invalid\n";
            goto LAB_001026ca;
          }
          strncpy(cmd.input_file,pcVar2,0xff);
          sVar7 = strlen(pcVar2);
          cmd.input_file[sVar7] = '\0';
          cmd.have_input = 1;
          break;
        case 'o':
          if (pcVar2 == (char *)0x0) {
            pcVar10 = "output file is invalid\n";
            goto LAB_001026ca;
          }
          strncpy(cmd.output_file,pcVar2,0xff);
          sVar7 = strlen(pcVar2);
          cmd.output_file[sVar7] = '\0';
          cmd.have_output = 1;
          break;
        default:
          if (cVar1 == 'w') {
            if (pcVar2 == (char *)0x0) {
              pcVar10 = "src width is invalid\n";
              goto LAB_001026ca;
            }
            cmd.src_w = atoi(pcVar2);
          }
        }
      }
    }
LAB_001026d8:
    if ((int)local_270 != 0) goto LAB_001026e3;
    __stream = (FILE *)0x0;
    pcVar2 = cmd.output_file;
    pcVar10 = cmd.input_file;
    _mpp_log_l(4,0,"src w:%d h:%d fmt:%d dst w:%d h:%d fmt:%d input:%s output:%s\n",0,cmd.src_w,
               cmd.src_h,cmd.src_fmt,cmd.dst_w,cmd.dst_h,cmd.dst_fmt,pcVar10,pcVar2);
    RVar5 = cmd.src_h;
    RVar4 = cmd.src_w;
    local_270 = (ulong)cmd.dst_w;
    uVar8 = (ulong)cmd.dst_h;
    if ((cmd.have_input == 0) || (__stream = fopen(pcVar10,"r"), __stream != (FILE *)0x0)) {
      local_258 = uVar8;
      if (cmd.have_output == 0) {
        __stream_00 = (FILE *)0x0;
      }
      else {
        __stream_00 = fopen(pcVar2,"w+");
        if (__stream_00 == (FILE *)0x0) {
          __stream_00 = (FILE *)0x0;
          _mpp_log_l(4,0,"open output file %s failed\n",0,pcVar2);
          MVar6 = MPP_NOK;
          goto LAB_001026f0;
        }
      }
      iVar11 = RVar4 * RVar5 * 4;
      MVar6 = mpp_buffer_get_with_tag(0,&src_buf,iVar11,0,"main");
      if (MVar6 == MPP_OK) {
        iVar11 = (int)local_270 * (int)local_258 * 4;
        MVar6 = mpp_buffer_get_with_tag(0,&dst_buf,iVar11,0,"main");
        if (MVar6 == MPP_OK) {
          MVar6 = mpp_frame_init(&src_frm);
          if (MVar6 == MPP_OK) {
            MVar6 = mpp_frame_init(&dst_frm);
            if (MVar6 == MPP_OK) {
              buf = (RK_U8 *)mpp_buffer_get_ptr_with_caller(src_buf,"main");
              if (cmd.have_input == 0) {
                MVar6 = fill_image(buf,cmd.src_w,cmd.src_h,cmd.src_w,cmd.src_h,cmd.src_fmt,0);
                if (MVar6 == MPP_OK) goto LAB_001029de;
                pcVar10 = "failed to fill input buffer ret:%d\n";
              }
              else {
                MVar6 = read_image(buf,(FILE *)__stream,cmd.src_w,cmd.src_h,cmd.src_w,cmd.src_h,
                                   cmd.dst_fmt);
                if (MVar6 == MPP_OK) {
LAB_001029de:
                  uVar8 = local_270;
                  mpp_frame_set_buffer(src_frm,src_buf);
                  mpp_frame_set_width(src_frm,RVar4);
                  mpp_frame_set_height(src_frm,RVar5);
                  mpp_frame_set_hor_stride(src_frm,RVar4 + 0xf & 0xfffffff0);
                  uVar9 = RVar5 + 0xf & 0xfffffff0;
                  mpp_frame_set_ver_stride(src_frm,uVar9);
                  mpp_frame_set_fmt(src_frm,cmd.src_fmt);
                  mpp_frame_set_buffer(dst_frm,dst_buf);
                  mpp_frame_set_width(dst_frm,uVar8 & 0xffffffff);
                  uVar3 = local_258;
                  mpp_frame_set_height(dst_frm,local_258 & 0xffffffff);
                  uVar12 = (int)uVar8 + 0xfU & 0xfffffff0;
                  mpp_frame_set_hor_stride(dst_frm,uVar12);
                  mpp_frame_set_ver_stride(dst_frm,(int)uVar3 + 0xfU & 0xfffffff0);
                  mpp_frame_set_fmt(dst_frm);
                  MVar6 = rga_init(&ctx);
                  if (MVar6 == MPP_OK) {
                    MVar6 = rga_control(ctx,RGA_CMD_INIT,(void *)0x0);
                    if (MVar6 == MPP_OK) {
                      MVar6 = rga_control(ctx,RGA_CMD_SET_SRC,src_frm);
                      if (MVar6 == MPP_OK) {
                        MVar6 = rga_control(ctx,RGA_CMD_SET_DST,dst_frm);
                        if (MVar6 == MPP_OK) {
                          MVar6 = rga_control(ctx,RGA_CMD_RUN_SYNC,(void *)0x0);
                          if (MVar6 == MPP_OK) {
                            mpp_frame_set_buffer(src_frm,dst_buf);
                            mpp_frame_set_width(src_frm,local_270);
                            mpp_frame_set_height(src_frm,local_258 >> 1 & 0x7fffffff);
                            mpp_frame_set_hor_stride(src_frm,uVar12 * 2);
                            mpp_frame_set_ver_stride(src_frm,uVar9 >> 1);
                            mpp_frame_set_fmt(src_frm);
                            MVar6 = rga_control(ctx,RGA_CMD_INIT,(void *)0x0);
                            if (MVar6 != MPP_OK) goto LAB_00102ac7;
                            MVar6 = rga_control(ctx,RGA_CMD_SET_SRC,src_frm);
                            if (MVar6 != MPP_OK) goto LAB_00102ae7;
                            MVar6 = rga_control(ctx,RGA_CMD_SET_DST,dst_frm);
                            if (MVar6 != MPP_OK) goto LAB_00102b08;
                            MVar6 = rga_control(ctx,RGA_CMD_RUN_SYNC,(void *)0x0);
                            if (MVar6 == MPP_OK) {
                              MVar6 = rga_deinit(ctx);
                              if (MVar6 == MPP_OK) {
                                MVar6 = MPP_OK;
                                if (cmd.have_output != 0) {
                                  dump_mpp_frame_to_file(dst_frm,(FILE *)__stream_00);
                                  MVar6 = MPP_OK;
                                }
                                goto LAB_001026f0;
                              }
                              pcVar10 = "deinit rga context failed %d\n";
                              goto LAB_00102b31;
                            }
                          }
                          pcVar10 = "rga cmd process copy failed %d\n";
                        }
                        else {
LAB_00102b08:
                          pcVar10 = "rga cmd setup destination failed %d\n";
                        }
                      }
                      else {
LAB_00102ae7:
                        pcVar10 = "rga cmd setup source failed %d\n";
                      }
                    }
                    else {
LAB_00102ac7:
                      pcVar10 = "rga cmd init failed %d\n";
                    }
                  }
                  else {
                    pcVar10 = "init rga context failed %d\n";
                  }
                }
                else {
                  pcVar10 = "failed to read input file ret:%d\n";
                }
              }
LAB_00102b31:
              _mpp_log_l(2,0,pcVar10,0,MVar6);
              goto LAB_001026f0;
            }
            pcVar10 = "failed to init dst frame\n";
          }
          else {
            pcVar10 = "failed to init src frame\n";
          }
          _mpp_log_l(2,0,pcVar10,0);
          goto LAB_001026f0;
        }
        pcVar10 = "failed to get dst buffer %d with size %d\n";
      }
      else {
        pcVar10 = "failed to get src buffer %d with size %d\n";
      }
      _mpp_log_l(2,0,pcVar10,0,MVar6,iVar11);
      goto LAB_001026f0;
    }
    _mpp_log_l(4,0,"open input file %s failed\n",0,pcVar10);
  }
  __stream_00 = (FILE *)0x0;
  __stream = (FILE *)0x0;
  MVar6 = MPP_NOK;
LAB_001026f0:
  if (src_frm != (MppFrame)0x0) {
    mpp_frame_deinit(&src_frm);
  }
  if (dst_frm != (MppFrame)0x0) {
    mpp_frame_deinit(&dst_frm);
  }
  if (src_buf != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(src_buf,"main");
  }
  if (dst_buf != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(dst_buf,"main");
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  _mpp_log_l(4,0,"rga test exit ret %d\n",0,MVar6);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    mpp_log("rga test unit\n");

    MPP_RET ret = MPP_NOK;
    RgaTestCmd cmd;
    MppBuffer src_buf = NULL;
    MppBuffer dst_buf = NULL;
    MppFrame src_frm = NULL;
    MppFrame dst_frm = NULL;
    FILE *fin = NULL;
    FILE *fout = NULL;
    RgaCtx ctx = NULL;
    RK_U32 frame_count = 0;

    void *ptr;
    RK_U32 src_w;
    RK_U32 src_h;
    RK_U32 dst_w;
    RK_U32 dst_h;
    RK_U32 src_size;
    RK_U32 dst_size;

    memset(&cmd, 0, sizeof(cmd));
    if (rga_test_parse_options(argc, argv, &cmd)) {
        usage();
        goto END;
    }

    mpp_log("src w:%d h:%d fmt:%d dst w:%d h:%d fmt:%d input:%s output:%s\n",
            cmd.src_w, cmd.src_h, cmd.src_fmt,
            cmd.dst_w, cmd.dst_h, cmd.dst_fmt,
            cmd.input_file, cmd.output_file);

    src_w = cmd.src_w;
    src_h = cmd.src_h;
    dst_w = cmd.dst_w;
    dst_h = cmd.dst_h;
    src_size = src_w * src_h * 4;
    dst_size = dst_w * dst_h * 4;

    if (cmd.have_input) {
        fin = fopen(cmd.input_file, "r");
        if (!fin) {
            mpp_log("open input file %s failed\n", cmd.input_file);
            goto END;
        }
    }

    if (cmd.have_output) {
        fout = fopen(cmd.output_file, "w+");
        if (!fout) {
            mpp_log("open output file %s failed\n", cmd.output_file);
            goto END;
        }
    }

    ret = mpp_buffer_get(NULL, &src_buf, src_size);
    if (ret) {
        mpp_err("failed to get src buffer %d with size %d\n", ret, src_size);
        goto END;
    }

    ret = mpp_buffer_get(NULL, &dst_buf, dst_size);
    if (ret) {
        mpp_err("failed to get dst buffer %d with size %d\n", ret, dst_size);
        goto END;
    }

    ret = mpp_frame_init(&src_frm);
    if (ret) {
        mpp_err("failed to init src frame\n");
        goto END;
    }

    ret = mpp_frame_init(&dst_frm);
    if (ret) {
        mpp_err("failed to init dst frame\n");
        goto END;
    }

    ptr = mpp_buffer_get_ptr(src_buf);
    if (cmd.have_input) {
        ret = read_image((RK_U8 *)ptr, fin, cmd.src_w, cmd.src_h,
                         cmd.src_w, cmd.src_h, cmd.dst_fmt);
        if (ret) {
            mpp_err("failed to read input file ret:%d\n", ret);
            goto END;
        }
    } else {
        ret = fill_image((RK_U8 *)ptr, cmd.src_w, cmd.src_h,
                         cmd.src_w, cmd.src_h, cmd.src_fmt, frame_count);
        if (ret) {
            mpp_err("failed to fill input buffer ret:%d\n", ret);
            goto END;
        }
    }

    mpp_frame_set_buffer(src_frm, src_buf);
    mpp_frame_set_width(src_frm, src_w);
    mpp_frame_set_height(src_frm, src_h);
    mpp_frame_set_hor_stride(src_frm, MPP_ALIGN(src_w, 16));
    mpp_frame_set_ver_stride(src_frm, MPP_ALIGN(src_h, 16));
    mpp_frame_set_fmt(src_frm, cmd.src_fmt);

    mpp_frame_set_buffer(dst_frm, dst_buf);
    mpp_frame_set_width(dst_frm, dst_w);
    mpp_frame_set_height(dst_frm, dst_h);
    mpp_frame_set_hor_stride(dst_frm, MPP_ALIGN(dst_w, 16));
    mpp_frame_set_ver_stride(dst_frm, MPP_ALIGN(dst_h, 16));
    mpp_frame_set_fmt(dst_frm, cmd.dst_fmt);

    ret = rga_init(&ctx);
    if (ret) {
        mpp_err("init rga context failed %d\n", ret);
        goto END;
    }

    // start copy process
    ret = rga_control(ctx, RGA_CMD_INIT, NULL);
    if (ret) {
        mpp_err("rga cmd init failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_SRC, src_frm);
    if (ret) {
        mpp_err("rga cmd setup source failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_DST, dst_frm);
    if (ret) {
        mpp_err("rga cmd setup destination failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_RUN_SYNC, NULL);
    if (ret) {
        mpp_err("rga cmd process copy failed %d\n", ret);
        goto END;
    }

    // start field duplicate process
    mpp_frame_set_buffer(src_frm, dst_buf);
    mpp_frame_set_width(src_frm, dst_w);
    mpp_frame_set_height(src_frm, dst_h / 2);
    mpp_frame_set_hor_stride(src_frm, MPP_ALIGN(dst_w, 16) * 2);
    mpp_frame_set_ver_stride(src_frm, MPP_ALIGN(src_h, 16) / 2);
    mpp_frame_set_fmt(src_frm, cmd.dst_fmt);

    ret = rga_control(ctx, RGA_CMD_INIT, NULL);
    if (ret) {
        mpp_err("rga cmd init failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_SRC, src_frm);
    if (ret) {
        mpp_err("rga cmd setup source failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_DST, dst_frm);
    if (ret) {
        mpp_err("rga cmd setup destination failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_RUN_SYNC, NULL);
    if (ret) {
        mpp_err("rga cmd process copy failed %d\n", ret);
        goto END;
    }

    ret = rga_deinit(ctx);
    if (ret) {
        mpp_err("deinit rga context failed %d\n", ret);
        goto END;
    }

    if (cmd.have_output)
        dump_mpp_frame_to_file(dst_frm, fout);

END:
    if (src_frm)
        mpp_frame_deinit(&src_frm);

    if (dst_frm)
        mpp_frame_deinit(&dst_frm);

    if (src_buf)
        mpp_buffer_put(src_buf);

    if (dst_buf)
        mpp_buffer_put(dst_buf);

    if (fin)
        fclose(fin);

    if (fout)
        fclose(fout);

    mpp_log("rga test exit ret %d\n", ret);
    return 0;
}